

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_write.cpp
# Opt level: O2

string * ScriptToAsmStr_abi_cxx11_
                   (string *__return_storage_ptr__,CScript *script,bool fAttemptSighashDecode)

{
  long lVar1;
  bool bVar2;
  CScript *pCVar3;
  _Alloc_hider _Var4;
  const_iterator cVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  uchar chSigHashType;
  const_iterator pc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vch;
  opcodetype opcode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string strSigHashDecode;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar6 = (script->super_CScriptBase)._size;
  pCVar3 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
  pc.ptr = (uchar *)pCVar3;
  if (uVar6 < 0x1d) {
    pc.ptr = (uchar *)script;
  }
  while( true ) {
    uVar8 = uVar6 - 0x1d;
    if (uVar6 < 0x1d) {
      uVar8 = uVar6;
    }
    if (uVar6 < 0x1d) {
      pCVar3 = script;
    }
    if ((pCVar3->super_CScriptBase)._union.direct + (int)uVar8 <= pc.ptr) goto LAB_00a81342;
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__," ");
    }
    bVar2 = CScript::GetOp(script,&pc,&opcode,&vch);
    if (!bVar2) break;
    if (opcode < OP_1NEGATE) {
      uVar7 = (long)vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if (uVar7 < 5) {
        CScriptNum::CScriptNum((CScriptNum *)&local_78,&vch,false,4);
        _Var4._M_p = local_78._M_dataplus._M_p;
        if ((long)local_78._M_dataplus._M_p < -0x7fffffff) {
          _Var4._M_p = (pointer)0xffffffff80000000;
        }
        if (0x7ffffffe < (long)_Var4._M_p) {
          _Var4._M_p = (pointer)0x7fffffff;
        }
        local_98._M_dataplus._M_p._0_4_ = SUB84(_Var4._M_p,0);
        tinyformat::format<int>(&strSigHashDecode,"%d",(int *)&local_98);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,&strSigHashDecode);
      }
      else {
        if (fAttemptSighashDecode) {
          bVar2 = CScript::IsUnspendable(script);
          if (!bVar2) {
            strSigHashDecode._M_dataplus._M_p = (pointer)&strSigHashDecode.field_2;
            strSigHashDecode._M_string_length = 0;
            strSigHashDecode.field_2._M_local_buf[0] = '\0';
            bVar2 = CheckSignatureEncoding(&vch,2,(ScriptError *)0x0);
            if (bVar2) {
              chSigHashType =
                   vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1];
              cVar5 = std::
                      _Rb_tree<unsigned_char,_std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::find(&mapSigHashTypes_abi_cxx11_._M_t,&chSigHashType);
              if ((_Rb_tree_header *)cVar5._M_node !=
                  &mapSigHashTypes_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
                std::operator+(&local_98,"[",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &cVar5._M_node[1]._M_parent);
                std::operator+(&local_78,&local_98,"]");
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(&strSigHashDecode,&local_78);
                std::__cxx11::string::~string((string *)&local_78);
                std::__cxx11::string::~string((string *)&local_98);
                vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish + -1;
              }
            }
            s_00.m_size = (long)vch.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)vch.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start;
            s_00.m_data = vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start;
            HexStr_abi_cxx11_(&local_98,s_00);
            std::operator+(&local_78,&local_98,&strSigHashDecode);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (__return_storage_ptr__,&local_78);
            std::__cxx11::string::~string((string *)&local_78);
            std::__cxx11::string::~string((string *)&local_98);
            goto LAB_00a8131a;
          }
          uVar7 = (long)vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
        }
        s.m_size = uVar7;
        s.m_data = vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
        HexStr_abi_cxx11_(&strSigHashDecode,s);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,&strSigHashDecode);
      }
    }
    else {
      GetOpName_abi_cxx11_(&strSigHashDecode,opcode);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&strSigHashDecode);
    }
LAB_00a8131a:
    std::__cxx11::string::~string((string *)&strSigHashDecode);
    uVar6 = (script->super_CScriptBase)._size;
    pCVar3 = (CScript *)(script->super_CScriptBase)._union.indirect_contents.indirect;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,"[error]");
LAB_00a81342:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&vch.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ScriptToAsmStr(const CScript& script, const bool fAttemptSighashDecode)
{
    std::string str;
    opcodetype opcode;
    std::vector<unsigned char> vch;
    CScript::const_iterator pc = script.begin();
    while (pc < script.end()) {
        if (!str.empty()) {
            str += " ";
        }
        if (!script.GetOp(pc, opcode, vch)) {
            str += "[error]";
            return str;
        }
        if (0 <= opcode && opcode <= OP_PUSHDATA4) {
            if (vch.size() <= static_cast<std::vector<unsigned char>::size_type>(4)) {
                str += strprintf("%d", CScriptNum(vch, false).getint());
            } else {
                // the IsUnspendable check makes sure not to try to decode OP_RETURN data that may match the format of a signature
                if (fAttemptSighashDecode && !script.IsUnspendable()) {
                    std::string strSigHashDecode;
                    // goal: only attempt to decode a defined sighash type from data that looks like a signature within a scriptSig.
                    // this won't decode correctly formatted public keys in Pubkey or Multisig scripts due to
                    // the restrictions on the pubkey formats (see IsCompressedOrUncompressedPubKey) being incongruous with the
                    // checks in CheckSignatureEncoding.
                    if (CheckSignatureEncoding(vch, SCRIPT_VERIFY_STRICTENC, nullptr)) {
                        const unsigned char chSigHashType = vch.back();
                        const auto it = mapSigHashTypes.find(chSigHashType);
                        if (it != mapSigHashTypes.end()) {
                            strSigHashDecode = "[" + it->second + "]";
                            vch.pop_back(); // remove the sighash type byte. it will be replaced by the decode.
                        }
                    }
                    str += HexStr(vch) + strSigHashDecode;
                } else {
                    str += HexStr(vch);
                }
            }
        } else {
            str += GetOpName(opcode);
        }
    }
    return str;
}